

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktGeometryTestsUtil.cpp
# Opt level: O2

bool vkt::geometry::compareWithFileImage
               (Context *context,ConstPixelBufferAccess *resultImage,string *testName)

{
  TestLog *pTVar1;
  bool bVar2;
  ConstPixelBufferAccess local_a8;
  TextureLevel referenceImage;
  string fileName;
  undefined1 *local_34;
  int local_2c;
  UVec4 local_28;
  
  tcu::TextureLevel::TextureLevel(&referenceImage);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_a8,
                 "vulkan/data/geometry/",testName);
  std::operator+(&fileName,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_a8,
                 ".png");
  std::__cxx11::string::~string((string *)&local_a8);
  tcu::ImageIO::loadPNG(&referenceImage,context->m_testCtx->m_curArchive,fileName._M_dataplus._M_p);
  pTVar1 = context->m_testCtx->m_log;
  tcu::TextureLevel::getAccess((PixelBufferAccess *)&local_a8,&referenceImage);
  bVar2 = tcu::fuzzyCompare(pTVar1,"ImageComparison","Image Comparison",&local_a8,resultImage,0.001,
                            COMPARE_LOG_RESULT);
  if (bVar2) {
    pTVar1 = context->m_testCtx->m_log;
    tcu::TextureLevel::getAccess((PixelBufferAccess *)&local_a8,&referenceImage);
    local_28.m_data[0] = 1;
    local_28.m_data[1] = 1;
    local_28.m_data[2] = 1;
    local_28.m_data[3] = 1;
    local_34 = &DAT_200000002;
    local_2c = 2;
    bVar2 = tcu::intThresholdPositionDeviationCompare
                      (pTVar1,"ImageComparison","Image Comparison",&local_a8,resultImage,&local_28,
                       (IVec3 *)&local_34,false,COMPARE_LOG_RESULT);
  }
  else {
    bVar2 = false;
  }
  std::__cxx11::string::~string((string *)&fileName);
  tcu::TextureLevel::~TextureLevel(&referenceImage);
  return bVar2;
}

Assistant:

bool compareWithFileImage (Context& context, const tcu::ConstPixelBufferAccess& resultImage, std::string testName)
{
	tcu::TextureLevel referenceImage;
	std::string fileName="vulkan/data/geometry/"+testName+".png";
	tcu::ImageIO::loadPNG(referenceImage, context.getTestContext().getArchive(), fileName.c_str());

	if (tcu::fuzzyCompare(context.getTestContext().getLog(), "ImageComparison", "Image Comparison",
								referenceImage.getAccess(), resultImage, 0.001f, tcu::COMPARE_LOG_RESULT))
		return tcu::intThresholdPositionDeviationCompare(context.getTestContext().getLog(), "ImageComparison", "Image Comparison",
														referenceImage.getAccess(), resultImage, tcu::UVec4(1u, 1u, 1u, 1u), tcu::IVec3(2,2,2), false, tcu::COMPARE_LOG_RESULT);
	else
		return false;
}